

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

StringRef __thiscall
llvm::yaml::ScalarNode::getValue(ScalarNode *this,SmallVectorImpl<char> *Storage)

{
  StringRef UnquotedValue_00;
  char cVar1;
  size_type i;
  size_t sVar2;
  StringRef *pSVar3;
  char *pcVar4;
  StringRef SVar5;
  StringRef Chars;
  undefined1 local_48 [8];
  StringRef UnquotedValue;
  
  pSVar3 = &this->Value;
  cVar1 = StringRef::operator[](pSVar3,0);
  if (cVar1 == '\"') {
    sVar2 = (this->Value).Length;
    UnquotedValue.Data = (char *)(sVar2 - (sVar2 != 0));
    local_48 = (undefined1  [8])((this->Value).Data + (sVar2 != 0));
    if ((char *)(sVar2 - 2) <= UnquotedValue.Data) {
      UnquotedValue.Data = (char *)(sVar2 - 2);
    }
    Chars.Length = 3;
    Chars.Data = "\\\r\n";
    i = StringRef::find_first_of((StringRef *)local_48,Chars,0);
    SVar5.Length = (size_t)UnquotedValue.Data;
    SVar5.Data = (char *)local_48;
    UnquotedValue_00.Length = (size_t)UnquotedValue.Data;
    UnquotedValue_00.Data = (char *)local_48;
    if (i != 0xffffffffffffffff) {
      SVar5 = unescapeDoubleQuoted(this,UnquotedValue_00,i,Storage);
    }
  }
  else {
    cVar1 = StringRef::operator[](pSVar3,0);
    if (cVar1 == '\'') {
      sVar2 = (this->Value).Length;
      UnquotedValue.Data = (char *)(sVar2 - (sVar2 != 0));
      local_48 = (undefined1  [8])((this->Value).Data + (sVar2 != 0));
      if ((char *)(sVar2 - 2) <= UnquotedValue.Data) {
        UnquotedValue.Data = (char *)(sVar2 - 2);
      }
      pSVar3 = (StringRef *)local_48;
      sVar2 = StringRef::find(pSVar3,'\'',0);
      if (sVar2 != 0xffffffffffffffff) {
        (Storage->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
        SmallVectorImpl<char>::reserve(Storage,(size_type)UnquotedValue.Data);
        while (sVar2 != 0xffffffffffffffff) {
          SmallVectorImpl<char>::insert<char_const*,void>
                    (Storage,(iterator)
                             ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                                     super_SmallVectorTemplateCommon<char,_void>.
                                     super_SmallVectorBase.Size +
                             (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX),(char *)local_48,(char *)((long)local_48 + sVar2));
          UnquotedValue.Length._7_1_ = 0x27;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&Storage->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((long)&UnquotedValue.Length + 7));
          pcVar4 = (char *)(sVar2 + 2);
          if (UnquotedValue.Data < (char *)(sVar2 + 2)) {
            pcVar4 = UnquotedValue.Data;
          }
          UnquotedValue.Data = UnquotedValue.Data + -(long)pcVar4;
          local_48 = (undefined1  [8])((long)local_48 + (long)pcVar4);
          sVar2 = StringRef::find(pSVar3,'\'',0);
        }
        SmallVectorImpl<char>::insert<char_const*,void>
                  (Storage,(iterator)
                           ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .Size +
                           (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 BeginX),(char *)local_48,UnquotedValue.Data + (long)local_48);
        UnquotedValue.Data =
             (char *)(ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        pSVar3 = (StringRef *)Storage;
      }
      SVar5.Length = (size_t)UnquotedValue.Data;
      SVar5.Data = pSVar3->Data;
    }
    else {
      SVar5 = StringRef::rtrim(pSVar3,' ');
    }
  }
  return SVar5;
}

Assistant:

StringRef ScalarNode::getValue(SmallVectorImpl<char> &Storage) const {
  // TODO: Handle newlines properly. We need to remove leading whitespace.
  if (Value[0] == '"') { // Double quoted.
    // Pull off the leading and trailing "s.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    // Search for characters that would require unescaping the value.
    StringRef::size_type i = UnquotedValue.find_first_of("\\\r\n");
    if (i != StringRef::npos)
      return unescapeDoubleQuoted(UnquotedValue, i, Storage);
    return UnquotedValue;
  } else if (Value[0] == '\'') { // Single quoted.
    // Pull off the leading and trailing 's.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    StringRef::size_type i = UnquotedValue.find('\'');
    if (i != StringRef::npos) {
      // We're going to need Storage.
      Storage.clear();
      Storage.reserve(UnquotedValue.size());
      for (; i != StringRef::npos; i = UnquotedValue.find('\'')) {
        StringRef Valid(UnquotedValue.begin(), i);
        Storage.insert(Storage.end(), Valid.begin(), Valid.end());
        Storage.push_back('\'');
        UnquotedValue = UnquotedValue.substr(i + 2);
      }
      Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
      return StringRef(Storage.begin(), Storage.size());
    }
    return UnquotedValue;
  }
  // Plain or block.
  return Value.rtrim(' ');
}